

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  ostream *poVar2;
  shared_ptr<ISpeak> messenger;
  CLI params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  __shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2> local_58;
  CLI local_40;
  
  CLI::CLI(&local_40,argc,argv);
  local_78 = (undefined8 *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_40.speaker == Whale) {
    std::make_shared<Whale>();
    std::__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<Whale,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
  }
  else if (local_40.speaker == Cow) {
    std::make_shared<Cow>();
    std::__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<Cow,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
  }
  else {
    std::make_shared<DefaultMessenger>();
    std::__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ISpeak,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<DefaultMessenger,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  std::make_shared<MessageHolder,std::__cxx11::string&>(&local_98);
  local_58._M_ptr = (element_type *)local_98._M_dataplus._M_p;
  local_58._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  puVar1 = local_78;
  std::__shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_68,&local_58);
  (**(code **)*puVar1)(&local_98,puVar1,&local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_98);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Parse cli parameters
    CLI params(argc, argv);

    // Populate messenger dependency
    std::shared_ptr<ISpeak> messenger;
    switch(params.speaker)
    {
    case Animal::Cow:
        messenger = make_shared<Cow>();
        break;
    case Animal::Whale:
        messenger = make_shared<Whale>();
        break;
    default:
        messenger = make_shared<DefaultMessenger>();
    }

	// Populate message dependency
    shared_ptr<IMessageHolder> message = make_shared<MessageHolder>(params.message);

    // Do Stuff
    cout << messenger->Say(message) << endl;
}